

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswBmc.c
# Opt level: O2

Aig_Obj_t * Ssw_BmcUnroll_rec(Ssw_Frm_t *pFrm,Aig_Obj_t *pObj,int f)

{
  Aig_Man_t *pAVar1;
  Vec_Ptr_t *pVVar2;
  uint uVar3;
  int iVar4;
  Aig_Obj_t *pAVar5;
  char *__function;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *Fill;
  int iVar6;
  Aig_Obj_t *pAVar7;
  char *__file;
  char *__assertion;
  
  pAVar5 = Ssw_ObjFrame_(pFrm,pObj,f);
  if (pAVar5 != (Aig_Obj_t *)0x0) {
    return pAVar5;
  }
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                  ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
  }
  uVar3 = (uint)*(undefined8 *)&pObj->field_0x18;
  if ((uVar3 & 7) == 2) {
    pAVar1 = pFrm->pAig;
    iVar6 = Aig_ObjCioId(pObj);
    if (iVar6 < pAVar1->nTruePis) {
      pAVar5 = Aig_ObjCreateCi(pFrm->pFrames);
      Fill = extraout_RDX_00;
      goto LAB_004e02a4;
    }
    uVar3 = (uint)*(undefined8 *)&pObj->field_0x18;
  }
  else if ((uVar3 & 7) == 1) {
    pAVar5 = pFrm->pFrames->pConst1;
    Fill = extraout_RDX;
    goto LAB_004e02a4;
  }
  if ((uVar3 & 7) == 3) {
    Ssw_BmcUnroll_rec(pFrm,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),f);
    pAVar5 = Ssw_ObjChild0Fra_(pFrm,pObj,f);
    Fill = extraout_RDX_01;
  }
  else {
    iVar6 = Saig_ObjIsLo(pFrm->pAig,pObj);
    if (iVar6 == 0) {
      if ((*(uint *)&pObj->field_0x18 & 7) - 7 < 0xfffffffe) {
        __assertion = "Aig_ObjIsNode(pObj)";
        __file = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswBmc.c"
        ;
        __function = "Aig_Obj_t *Ssw_BmcUnroll_rec(Ssw_Frm_t *, Aig_Obj_t *, int)";
        uVar3 = 0x44;
LAB_004e0355:
        __assert_fail(__assertion,__file,uVar3,__function);
      }
      Ssw_BmcUnroll_rec(pFrm,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),f);
      Ssw_BmcUnroll_rec(pFrm,(Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),f);
      pAVar5 = Ssw_ObjChild0Fra_(pFrm,pObj,f);
      pAVar7 = (Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
      if (pAVar7 == (Aig_Obj_t *)0x0) {
        pAVar7 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar7 = Ssw_ObjFrame_(pFrm,pAVar7,f);
        pAVar7 = (Aig_Obj_t *)((ulong)((uint)pObj->pFanin1 & 1) ^ (ulong)pAVar7);
      }
      pAVar5 = Aig_And(pFrm->pFrames,pAVar5,pAVar7);
      Fill = extraout_RDX_04;
    }
    else if (f == 0) {
      pAVar5 = (Aig_Obj_t *)((ulong)pFrm->pFrames->pConst1 ^ 1);
      Fill = extraout_RDX_02;
    }
    else {
      pAVar1 = pFrm->pAig;
      iVar6 = Saig_ObjIsLo(pAVar1,pObj);
      if (iVar6 == 0) {
        __assertion = "Saig_ObjIsLo(p, pObj)";
        __file = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saig.h"
        ;
        __function = "Aig_Obj_t *Saig_ObjLoToLi(Aig_Man_t *, Aig_Obj_t *)";
        uVar3 = 0x56;
        goto LAB_004e0355;
      }
      pVVar2 = pAVar1->vCos;
      iVar6 = pAVar1->nTruePos;
      iVar4 = Aig_ObjCioId(pObj);
      pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pVVar2,(iVar6 + iVar4) - pAVar1->nTruePis);
      pAVar5 = Ssw_BmcUnroll_rec(pFrm,pAVar5,f + -1);
      Fill = extraout_RDX_03;
    }
  }
LAB_004e02a4:
  iVar6 = f * pFrm->nObjs;
  pVVar2 = pFrm->vAig2Frm;
  uVar3 = iVar6 + pObj->Id;
  Vec_PtrFillExtra(pVVar2,iVar6 + pObj->Id + 1,Fill);
  if ((-1 < (int)uVar3) && ((int)uVar3 < pVVar2->nSize)) {
    pVVar2->pArray[uVar3] = pAVar5;
    return pAVar5;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Incrementally unroll the timeframes.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Aig_Obj_t * Ssw_BmcUnroll_rec( Ssw_Frm_t * pFrm, Aig_Obj_t * pObj, int f )
{
    Aig_Obj_t * pRes, * pRes0, * pRes1;
    if ( (pRes = Ssw_ObjFrame_(pFrm, pObj, f)) )
        return pRes;
    if ( Aig_ObjIsConst1(pObj) )
        pRes = Aig_ManConst1( pFrm->pFrames );
    else if ( Saig_ObjIsPi(pFrm->pAig, pObj) )
        pRes = Aig_ObjCreateCi( pFrm->pFrames );
    else if ( Aig_ObjIsCo(pObj) )
    {
        Ssw_BmcUnroll_rec( pFrm, Aig_ObjFanin0(pObj), f );
        pRes = Ssw_ObjChild0Fra_( pFrm, pObj, f );
    }
    else if ( Saig_ObjIsLo(pFrm->pAig, pObj) )
    {
        if ( f == 0 )
            pRes = Aig_ManConst0( pFrm->pFrames );
        else
            pRes = Ssw_BmcUnroll_rec( pFrm, Saig_ObjLoToLi(pFrm->pAig, pObj), f-1 );
    }
    else
    {
        assert( Aig_ObjIsNode(pObj) );
        Ssw_BmcUnroll_rec( pFrm, Aig_ObjFanin0(pObj), f );
        Ssw_BmcUnroll_rec( pFrm, Aig_ObjFanin1(pObj), f );
        pRes0 = Ssw_ObjChild0Fra_( pFrm, pObj, f );
        pRes1 = Ssw_ObjChild1Fra_( pFrm, pObj, f );
        pRes = Aig_And( pFrm->pFrames, pRes0, pRes1 );
    }
    Ssw_ObjSetFrame_( pFrm, pObj, f, pRes );
    return pRes;
}